

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_clear(void)

{
  initializer_list<int> input;
  undefined4 local_74;
  size_type local_70;
  undefined4 local_64;
  size_type local_60 [2];
  int local_50 [4];
  iterator local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  local_50[0] = 0xb;
  local_50[1] = 0x16;
  local_50[2] = 0x21;
  local_50[3] = 0x2c;
  local_40 = local_50;
  local_38 = 4;
  input._M_len = 4;
  input._M_array = local_40;
  vista::circular_view<int,_4UL>::operator=((circular_view<int,_4UL> *)local_30,input);
  local_60[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_64 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x39d,"void api_fixed_suite::fixed_clear()",local_60,&local_64);
  vista::circular_view<int,_4UL>::clear((circular_view<int,_4UL> *)local_30);
  local_70 = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x39f,"void api_fixed_suite::fixed_clear()",&local_70,&local_74);
  return;
}

Assistant:

void fixed_clear()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.clear();
    BOOST_TEST_EQ(span.size(), 0);
}